

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoApproveIfMissingReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::AutoApproveIfMissingReporter::report
          (AutoApproveIfMissingReporter *this,string *received,string *approved)

{
  bool bVar1;
  AutoApproveReporter local_58;
  string local_50;
  string local_30;
  
  bVar1 = FileUtils::fileExists(approved);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    local_58.super_Reporter._vptr_Reporter = (Reporter)&PTR__Reporter_001a1918;
    ::std::__cxx11::string::string((string *)&local_30,(string *)received);
    ::std::__cxx11::string::string((string *)&local_50,(string *)approved);
    bVar1 = AutoApproveReporter::report(&local_58,&local_30,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool AutoApproveIfMissingReporter::report(std::string received,
                                              std::string approved) const
    {
        if (FileUtils::fileExists(approved))
        {
            return false;
        }

        return AutoApproveReporter().report(received, approved);
    }